

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Translator_X86.cpp
# Opt level: O3

int TestRegRegEncoding(CodeGenGenericContext *ctx,uchar *stream,x86Command op,
                      _func_int_uchar_ptr_x86Reg_x86Reg *fun)

{
  x86Reg reg1;
  x86Reg reg2;
  int iVar1;
  uchar *puVar2;
  long lVar3;
  long lVar4;
  int local_48;
  
  lVar3 = 0;
  puVar2 = stream;
  do {
    reg1 = testRegs[lVar3];
    lVar4 = 0;
    do {
      reg2 = *(x86Reg *)((long)testRegs + lVar4);
      EMIT_OP_REG_REG(ctx,op,reg1,reg2);
      iVar1 = (*fun)(puVar2,reg1,reg2);
      puVar2 = puVar2 + iVar1;
      lVar4 = lVar4 + 4;
    } while (lVar4 != 0x24);
    lVar3 = lVar3 + 1;
  } while (lVar3 != 9);
  local_48 = (int)stream;
  return (int)puVar2 - local_48;
}

Assistant:

int TestRegRegEncoding(CodeGenGenericContext &ctx, unsigned char *stream, x86Command op, int (*fun)(unsigned char *stream, x86Reg dst, x86Reg src))
{
	unsigned char *start = stream;

	for(unsigned reg1 = 0; reg1 < sizeof(testRegs) / sizeof(testRegs[0]); reg1++)
	{
		for(unsigned reg2 = 0; reg2 < sizeof(testRegs) / sizeof(testRegs[0]); reg2++)
		{
			EMIT_OP_REG_REG(ctx, op, testRegs[reg1], testRegs[reg2]);
			stream += fun(stream, testRegs[reg1], testRegs[reg2]);
		}
	}

	return int(stream - start);
}